

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp_client.cc
# Opt level: O3

bool __thiscall raptor::TcpClient::Send(TcpClient *this,void *buff,size_t len)

{
  int iVar1;
  Slice SStack_48;
  
  iVar1 = this->_fd;
  if (iVar1 != -1) {
    pthread_mutex_lock((pthread_mutex_t *)&this->_s_mtx);
    Slice::Slice(&SStack_48,buff,len);
    SliceBuffer::AddSlice(&this->_snd_buffer,&SStack_48);
    Slice::~Slice(&SStack_48);
    pthread_mutex_unlock((pthread_mutex_t *)&this->_s_mtx);
  }
  return iVar1 != -1;
}

Assistant:

bool TcpClient::IsOnline() const {
    return (_fd != -1);
}